

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validatePaddingLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  NeuralNetworkLayer *pNVar1;
  bool bVar2;
  int iVar3;
  PaddingTypeCase PVar4;
  BorderAmounts *pBVar5;
  string *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_158 [8];
  string err_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [8];
  string err;
  PaddingLayerParams *params;
  string local_88;
  byte local_62;
  allocator<char> local_61;
  string local_60;
  byte local_3a;
  byte local_39;
  uint local_38;
  byte local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    local_21 = 1;
  }
  local_38 = (uint)!bVar2;
  if ((local_21 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 == 0) {
    local_39 = 0;
    validateOutputCount(__return_storage_ptr__,local_20,1,1);
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      local_39 = 1;
    }
    local_38 = (uint)!bVar2;
    if ((local_39 & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    pNVar1 = local_20;
    if (local_38 == 0) {
      if ((this->ndArrayInterpretation & 1U) != 0) {
        local_3a = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Padding",&local_61);
        validateInputOutputRankEquality
                  (__return_storage_ptr__,pNVar1,&local_60,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_60);
        std::allocator<char>::~allocator(&local_61);
        bVar2 = Result::good(__return_storage_ptr__);
        if (!bVar2) {
          local_3a = 1;
        }
        local_38 = (uint)!bVar2;
        if ((local_3a & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        pNVar1 = local_20;
        if (local_38 != 0) {
          return __return_storage_ptr__;
        }
        local_62 = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"Padding",(allocator<char> *)((long)&params + 7));
        validateRankCount(__return_storage_ptr__,pNVar1,&local_88,2,-1,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_88);
        std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
        bVar2 = Result::good(__return_storage_ptr__);
        if (!bVar2) {
          local_62 = 1;
        }
        local_38 = (uint)!bVar2;
        if ((local_62 & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        if (local_38 != 0) {
          return __return_storage_ptr__;
        }
      }
      err.field_2._8_8_ = Specification::NeuralNetworkLayer::padding(local_20);
      pBVar5 = Specification::PaddingLayerParams::paddingamounts
                         ((PaddingLayerParams *)err.field_2._8_8_);
      iVar3 = Specification::BorderAmounts::borderamounts_size(pBVar5);
      if (iVar3 != 0) {
        pBVar5 = Specification::PaddingLayerParams::paddingamounts
                           ((PaddingLayerParams *)err.field_2._8_8_);
        iVar3 = Specification::BorderAmounts::borderamounts_size(pBVar5);
        if (iVar3 != 2) {
          psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
          std::operator+(&local_118,"Padding layer ",psVar6);
          std::operator+(&local_f8,&local_118," specifies ");
          pBVar5 = Specification::PaddingLayerParams::paddingamounts
                             ((PaddingLayerParams *)err.field_2._8_8_);
          iVar3 = Specification::BorderAmounts::borderamounts_size(pBVar5);
          std::__cxx11::to_string((string *)((long)&err_1.field_2 + 8),iVar3);
          std::operator+(&local_d8,&local_f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&err_1.field_2 + 8));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8,&local_d8,
                         " padding amounts but it must either specify 2 (for x and y axes), or 0 for the default values."
                        );
          std::__cxx11::string::~string((string *)&local_d8);
          std::__cxx11::string::~string((string *)(err_1.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_118);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_b8);
          local_38 = 1;
          std::__cxx11::string::~string((string *)local_b8);
          return __return_storage_ptr__;
        }
      }
      PVar4 = Specification::PaddingLayerParams::PaddingType_case
                        ((PaddingLayerParams *)err.field_2._8_8_);
      if (PVar4 == PADDINGTYPE_NOT_SET) {
        psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
        std::operator+(&local_178,"Padding layer ",psVar6);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_158,&local_178," padding type is not set.");
        std::__cxx11::string::~string((string *)&local_178);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_158);
        local_38 = 1;
        std::__cxx11::string::~string((string *)local_158);
      }
      else {
        Result::Result(__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validatePaddingLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Padding", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Padding", 2, -1, blobNameToRank));
    }

    const auto& params = layer.padding();
    if (!(params.paddingamounts().borderamounts_size() == 0
          || params.paddingamounts().borderamounts_size() == 2)) {
        std::string err = "Padding layer " + layer.name() + " specifies " + std::to_string(params.paddingamounts().borderamounts_size()) + " padding amounts but it must either specify 2 (for x and y axes), or 0 for the default values.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (params.PaddingType_case() == Specification::PaddingLayerParams::PaddingTypeCase::PADDINGTYPE_NOT_SET) {
        std::string err = "Padding layer " + layer.name() + " padding type is not set.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return Result();
}